

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

void __thiscall kj::OwnFd::~OwnFd(OwnFd *this)

{
  int iVar1;
  int *piVar2;
  Fault f;
  Fault local_10;
  
  if (-1 < this->fd) {
    iVar1 = close(this->fd);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      kj::_::Debug::Fault::Fault<int,int&>
                (&local_10,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x14e,*piVar2,"close","fd",&this->fd);
      kj::_::Debug::Fault::~Fault(&local_10);
    }
  }
  return;
}

Assistant:

OwnFd::~OwnFd() noexcept(false) {
  if (fd >= 0) {
    // Don't use SYSCALL() here because close() should not be repeated on EINTR.
    if (miniposix::close(fd) < 0) {
      KJ_FAIL_SYSCALL("close", errno, fd) {
        // This ensures we don't throw an exception if unwinding.
        break;
      }
    }
  }
}